

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  FieldDescriptor *field;
  
  field = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return instance.has$capitalized_name$();\n}\n"
                      );
    field = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
    if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) goto LAB_002c5cbe;
  }
  WriteFieldDocComment(printer,field);
  pmVar1 = &(this->super_ImmutableEnumFieldLiteGenerator).variables_;
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public int get$capitalized_name$Value() {\n  return instance.get$capitalized_name$Value();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder set$capitalized_name$Value(int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(value);\n  return this;\n}\n"
                    );
  field = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
LAB_002c5cbe:
  WriteFieldDocComment(printer,field);
  pmVar1 = &(this->super_ImmutableEnumFieldLiteGenerator).variables_;
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder set$capitalized_name$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,pmVar1,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return instance.has$capitalized_name$();\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  return instance.get$capitalized_name$Value();\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public Builder set$capitalized_name$Value(int value) {\n"
      "  copyOnWrite();\n"
      "  instance.set$capitalized_name$Value(value);\n"
      "  return this;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  return instance.get$capitalized_name$();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$($type$ value) {\n"
    "  copyOnWrite();\n"
    "  instance.set$capitalized_name$(value);\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  copyOnWrite();\n"
    "  instance.clear$capitalized_name$();\n"
    "  return this;\n"
    "}\n");
}